

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Issue.cpp
# Opt level: O0

ostream * jbcoin::operator<<(ostream *os,Issue *x)

{
  Issue *in_RDX;
  string local_38;
  Issue *local_18;
  Issue *x_local;
  ostream *os_local;
  
  local_18 = x;
  x_local = (Issue *)os;
  to_string_abi_cxx11_(&local_38,(jbcoin *)x,in_RDX);
  std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)x_local;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, Issue const& x)
{
    os << to_string (x);
    return os;
}